

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * MemOSRealloc(void *pOld,sxu32 nBytes)

{
  sxu32 *psVar1;
  sxu32 *pChunk;
  sxu32 *pOldChunk;
  sxu32 nBytes_local;
  void *pOld_local;
  
  pOld_local = pOld;
  if (*(uint *)((long)pOld + -4) < nBytes) {
    psVar1 = (sxu32 *)SyOSHeapRealloc((uint *)((long)pOld + -4),nBytes + 4);
    if (psVar1 == (sxu32 *)0x0) {
      pOld_local = (void *)0x0;
    }
    else {
      *psVar1 = nBytes;
      pOld_local = psVar1 + 1;
    }
  }
  return pOld_local;
}

Assistant:

static void * MemOSRealloc(void *pOld, sxu32 nBytes)
{
	sxu32 *pOldChunk;
	sxu32 *pChunk;
	pOldChunk = (sxu32 *)(((char *)pOld)-sizeof(sxu32));
	if( pOldChunk[0] >= nBytes ){
		return pOld;
	}
	pChunk = (sxu32 *)SyOSHeapRealloc(pOldChunk, nBytes + sizeof(sxu32));
	if( pChunk == 0 ){
		return 0;
	}
	pChunk[0] = nBytes;
	return (void *)&pChunk[1];
}